

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

int __thiscall Console::init(Console *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ROM *pRVar2;
  APU *this_00;
  PPU *this_01;
  CPU *this_02;
  Memory *this_03;
  Controller *this_04;
  string *this_05;
  string local_40 [32];
  
  this->prev_frame = 0;
  pRVar2 = (ROM *)operator_new(0x2030);
  ROM::ROM(pRVar2);
  this->rom = pRVar2;
  this_00 = (APU *)operator_new(1);
  APU::APU(this_00);
  this->apu = this_00;
  this_01 = (PPU *)operator_new(0xac8);
  PPU::PPU(this_01,this_00);
  this->ppu = this_01;
  this_02 = (CPU *)operator_new(0x30);
  CPU::CPU(this_02);
  this->cpu = this_02;
  this_03 = (Memory *)operator_new(0x830);
  Memory::Memory(this_03);
  this->mem = this_03;
  this_04 = (Controller *)operator_new(10);
  Controller::Controller(this_04);
  this->controller = this_04;
  APU::init(this->apu,(EVP_PKEY_CTX *)this_00);
  pRVar2 = this->rom;
  this_05 = local_40;
  std::__cxx11::string::string(this_05,(string *)ctx);
  ROM::init(pRVar2,(EVP_PKEY_CTX *)this_05);
  std::__cxx11::string::~string(local_40);
  Memory::init(this->mem,(EVP_PKEY_CTX *)this_05);
  CPU::init(this->cpu,(EVP_PKEY_CTX *)this_05);
  iVar1 = PPU::init(this->ppu,(EVP_PKEY_CTX *)this_05);
  return iVar1;
}

Assistant:

void Console::init(std::string filename) {
    prev_frame = 0;
    rom = new ROM();
    apu = new APU();
    ppu = new PPU(apu);
    cpu = new CPU();
    mem = new Memory();
    controller = new Controller();
    apu->init();
    rom->init(std::move(filename));
    mem->init();
    cpu->init();
    ppu->init();
}